

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int key_schedule_extract(ptls_key_schedule_t *sched,ptls_iovec_t ikm)

{
  ptls_iovec_t ikm_00;
  ptls_iovec_t salt;
  int iVar1;
  long in_RSI;
  int *in_RDI;
  ptls_iovec_t pVar2;
  char *in_stack_00000068;
  size_t in_stack_00000070;
  void *in_stack_00000078;
  ptls_hash_algorithm_t *in_stack_00000080;
  int ret;
  undefined1 in_stack_000000a0 [16];
  char *in_stack_000000b0;
  void *output;
  ptls_hash_algorithm_t *algo;
  uint8_t *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  uint8_t *in_stack_ffffffffffffff90;
  
  if (in_RSI == 0) {
    ptls_iovec_init("",*(size_t *)(*(long *)(in_RDI + 0x16) + 8));
  }
  if (*in_RDI != 0) {
    in_stack_ffffffffffffff80 = *(uint8_t **)(in_RDI + 0x16);
    in_stack_ffffffffffffff88 = in_RDI + 4;
    in_stack_ffffffffffffff90 = *(uint8_t **)(*(long *)(in_RDI + 0x16) + 8);
    ptls_iovec_init(in_RDI + 4,*(size_t *)(*(long *)(in_RDI + 0x16) + 8));
    ptls_iovec_init((void *)(*(long *)(in_RDI + 0x16) + 0x18),
                    *(size_t *)(*(long *)(in_RDI + 0x16) + 8));
    pVar2.len = (size_t)ikm.base;
    pVar2.base = (uint8_t *)sched;
    iVar1 = hkdf_expand_label(in_stack_00000080,in_stack_00000078,in_stack_00000070,pVar2,
                              in_stack_00000068,(ptls_iovec_t)in_stack_000000a0,in_stack_000000b0);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  *in_RDI = *in_RDI + 1;
  output = *(void **)(in_RDI + 0x16);
  algo = (ptls_hash_algorithm_t *)(in_RDI + 4);
  pVar2 = ptls_iovec_init(in_RDI + 4,*(size_t *)(*(long *)(in_RDI + 0x16) + 8));
  salt.len = (size_t)pVar2.base;
  salt.base = in_stack_ffffffffffffff90;
  ikm_00.len = (size_t)in_stack_ffffffffffffff88;
  ikm_00.base = in_stack_ffffffffffffff80;
  iVar1 = ptls_hkdf_extract(algo,output,salt,ikm_00);
  return iVar1;
}

Assistant:

static int key_schedule_extract(ptls_key_schedule_t *sched, ptls_iovec_t ikm)
{
    int ret;

    if (ikm.base == NULL)
        ikm = ptls_iovec_init(zeroes_of_max_digest_size, sched->hashes[0].algo->digest_size);

    if (sched->generation != 0 &&
        (ret = hkdf_expand_label(sched->hashes[0].algo, sched->secret, sched->hashes[0].algo->digest_size,
                                 ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), "derived",
                                 ptls_iovec_init(sched->hashes[0].algo->empty_digest, sched->hashes[0].algo->digest_size),
                                 sched->hkdf_label_prefix)) != 0)
        return ret;

    ++sched->generation;
    ret = ptls_hkdf_extract(sched->hashes[0].algo, sched->secret,
                            ptls_iovec_init(sched->secret, sched->hashes[0].algo->digest_size), ikm);
    PTLS_DEBUGF("%s: %u, %02x%02x\n", __FUNCTION__, sched->generation, (int)sched->secret[0], (int)sched->secret[1]);
    return ret;
}